

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_partial_sign
              (secp256k1_context *ctx,secp256k1_musig_partial_sig *partial_sig,
              secp256k1_musig_secnonce *secnonce,secp256k1_keypair *keypair,
              secp256k1_musig_keyagg_cache *keyagg_cache,secp256k1_musig_session *session)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  void *in_RDX;
  long in_RSI;
  long in_R8;
  long in_R9;
  int ret;
  secp256k1_musig_session_internal session_i;
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_scalar s;
  secp256k1_scalar mu;
  secp256k1_scalar k [2];
  secp256k1_ge keypair_pk;
  secp256k1_ge pk;
  secp256k1_scalar sk;
  secp256k1_keyagg_cache_internal *in_stack_fffffffffffffce8;
  uint in_stack_fffffffffffffcf0;
  uint uVar3;
  undefined4 in_stack_fffffffffffffcf4;
  int in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  secp256k1_ge *in_stack_fffffffffffffd00;
  secp256k1_context *in_stack_fffffffffffffd08;
  secp256k1_context *in_stack_fffffffffffffd10;
  secp256k1_scalar *in_stack_fffffffffffffd18;
  secp256k1_scalar *in_stack_fffffffffffffd20;
  secp256k1_scalar *in_stack_fffffffffffffd28;
  secp256k1_scalar *in_stack_fffffffffffffd30;
  secp256k1_fe asStack_258 [5];
  int local_190;
  long local_38;
  long local_30;
  long local_28;
  void *local_20;
  long local_18;
  int local_4;
  
  if (in_RDX == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
               (char *)in_stack_fffffffffffffce8);
    local_4 = 0;
  }
  else {
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    iVar1 = secp256k1_musig_secnonce_load
                      (in_stack_fffffffffffffd08,(secp256k1_scalar *)in_stack_fffffffffffffd00,
                       (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                       ,(secp256k1_musig_secnonce *)
                        CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    memset(local_20,0,0x84);
    if (iVar1 == 0) {
      secp256k1_musig_partial_sign_clear
                ((secp256k1_scalar *)(ulong)in_stack_fffffffffffffcf0,
                 (secp256k1_scalar *)in_stack_fffffffffffffce8);
      local_4 = 0;
    }
    else if (local_18 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(iVar1,in_stack_fffffffffffffcf0),
                 (char *)in_stack_fffffffffffffce8);
      local_4 = 0;
    }
    else if (local_28 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(iVar1,in_stack_fffffffffffffcf0),
                 (char *)in_stack_fffffffffffffce8);
      local_4 = 0;
    }
    else if (local_30 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(iVar1,in_stack_fffffffffffffcf0),
                 (char *)in_stack_fffffffffffffce8);
      local_4 = 0;
    }
    else if (local_38 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(iVar1,in_stack_fffffffffffffcf0),
                 (char *)in_stack_fffffffffffffce8);
      local_4 = 0;
    }
    else {
      iVar2 = secp256k1_keypair_load
                        (in_stack_fffffffffffffd10,(secp256k1_scalar *)in_stack_fffffffffffffd08,
                         in_stack_fffffffffffffd00,
                         (secp256k1_keypair *)
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      if (iVar2 == 0) {
        secp256k1_musig_partial_sign_clear
                  ((secp256k1_scalar *)CONCAT44(iVar1,in_stack_fffffffffffffcf0),
                   (secp256k1_scalar *)in_stack_fffffffffffffce8);
        local_4 = 0;
      }
      else {
        iVar2 = secp256k1_fe_equal((secp256k1_fe *)in_stack_fffffffffffffd10,
                                   (secp256k1_fe *)in_stack_fffffffffffffd08);
        uVar3 = in_stack_fffffffffffffcf0 & 0xffffff;
        if (iVar2 != 0) {
          iVar2 = secp256k1_fe_equal((secp256k1_fe *)in_stack_fffffffffffffd10,
                                     (secp256k1_fe *)in_stack_fffffffffffffd08);
          uVar3 = CONCAT13(iVar2 != 0,(int3)uVar3);
        }
        if ((((byte)(uVar3 >> 0x18) ^ 0xff) & 1) == 0) {
          iVar2 = secp256k1_keyagg_cache_load
                            ((secp256k1_context *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                             (secp256k1_keyagg_cache_internal *)CONCAT44(iVar1,uVar3),
                             (secp256k1_musig_keyagg_cache *)in_stack_fffffffffffffce8);
          if (iVar2 == 0) {
            secp256k1_musig_partial_sign_clear
                      ((secp256k1_scalar *)CONCAT44(iVar1,uVar3),
                       (secp256k1_scalar *)in_stack_fffffffffffffce8);
            local_4 = 0;
          }
          else {
            iVar2 = secp256k1_fe_impl_is_odd(asStack_258);
            if (iVar2 != local_190) {
              secp256k1_scalar_negate
                        ((secp256k1_scalar *)in_stack_fffffffffffffd00,
                         (secp256k1_scalar *)
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
            }
            secp256k1_musig_keyaggcoef
                      ((secp256k1_scalar *)CONCAT44(iVar1,uVar3),in_stack_fffffffffffffce8,
                       (secp256k1_ge *)0x10ca58);
            secp256k1_scalar_mul
                      (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20
                      );
            iVar2 = secp256k1_musig_session_load
                              ((secp256k1_context *)
                               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                               (secp256k1_musig_session_internal *)CONCAT44(iVar1,uVar3),
                               (secp256k1_musig_session *)in_stack_fffffffffffffce8);
            if (iVar2 == 0) {
              secp256k1_musig_partial_sign_clear
                        ((secp256k1_scalar *)CONCAT44(iVar1,uVar3),
                         (secp256k1_scalar *)in_stack_fffffffffffffce8);
              local_4 = 0;
            }
            else {
              if (in_stack_fffffffffffffcf8 != 0) {
                secp256k1_scalar_negate
                          ((secp256k1_scalar *)in_stack_fffffffffffffd00,
                           (secp256k1_scalar *)
                           CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
                secp256k1_scalar_negate
                          ((secp256k1_scalar *)in_stack_fffffffffffffd00,
                           (secp256k1_scalar *)
                           CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
              }
              secp256k1_scalar_mul
                        (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                         in_stack_fffffffffffffd20);
              secp256k1_scalar_mul
                        (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                         in_stack_fffffffffffffd20);
              secp256k1_scalar_add
                        (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                         (secp256k1_scalar *)in_stack_fffffffffffffd10);
              secp256k1_scalar_add
                        (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                         (secp256k1_scalar *)in_stack_fffffffffffffd10);
              secp256k1_musig_partial_sig_save
                        ((secp256k1_musig_partial_sig *)CONCAT44(iVar1,uVar3),
                         (secp256k1_scalar *)in_stack_fffffffffffffce8);
              secp256k1_musig_partial_sign_clear
                        ((secp256k1_scalar *)CONCAT44(iVar1,uVar3),
                         (secp256k1_scalar *)in_stack_fffffffffffffce8);
              local_4 = 1;
            }
          }
        }
        else {
          secp256k1_callback_call
                    ((secp256k1_callback *)CONCAT44(iVar1,uVar3),(char *)in_stack_fffffffffffffce8);
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_musig_partial_sign(const secp256k1_context* ctx, secp256k1_musig_partial_sig *partial_sig, secp256k1_musig_secnonce *secnonce, const secp256k1_keypair *keypair, const secp256k1_musig_keyagg_cache *keyagg_cache, const secp256k1_musig_session *session) {
    secp256k1_scalar sk;
    secp256k1_ge pk, keypair_pk;
    secp256k1_scalar k[2];
    secp256k1_scalar mu, s;
    secp256k1_keyagg_cache_internal cache_i;
    secp256k1_musig_session_internal session_i;
    int ret;

    VERIFY_CHECK(ctx != NULL);

    ARG_CHECK(secnonce != NULL);
    /* Fails if the magic doesn't match */
    ret = secp256k1_musig_secnonce_load(ctx, k, &pk, secnonce);
    /* Set nonce to zero to avoid nonce reuse. This will cause subsequent calls
     * of this function to fail */
    memset(secnonce, 0, sizeof(*secnonce));
    if (!ret) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }

    ARG_CHECK(partial_sig != NULL);
    ARG_CHECK(keypair != NULL);
    ARG_CHECK(keyagg_cache != NULL);
    ARG_CHECK(session != NULL);

    if (!secp256k1_keypair_load(ctx, &sk, &keypair_pk, keypair)) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }
    ARG_CHECK(secp256k1_fe_equal(&pk.x, &keypair_pk.x)
              && secp256k1_fe_equal(&pk.y, &keypair_pk.y));
    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }

    /* Negate sk if secp256k1_fe_is_odd(&cache_i.pk.y)) XOR cache_i.parity_acc.
     * This corresponds to the line "Let d = g⋅gacc⋅d' mod n" in the
     * specification. */
    if ((secp256k1_fe_is_odd(&cache_i.pk.y)
         != cache_i.parity_acc)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    /* Multiply KeyAgg coefficient */
    secp256k1_musig_keyaggcoef(&mu, &cache_i, &pk);
    secp256k1_scalar_mul(&sk, &sk, &mu);

    if (!secp256k1_musig_session_load(ctx, &session_i, session)) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }

    if (session_i.fin_nonce_parity) {
        secp256k1_scalar_negate(&k[0], &k[0]);
        secp256k1_scalar_negate(&k[1], &k[1]);
    }

    /* Sign */
    secp256k1_scalar_mul(&s, &session_i.challenge, &sk);
    secp256k1_scalar_mul(&k[1], &session_i.noncecoef, &k[1]);
    secp256k1_scalar_add(&k[0], &k[0], &k[1]);
    secp256k1_scalar_add(&s, &s, &k[0]);
    secp256k1_musig_partial_sig_save(partial_sig, &s);
    secp256k1_musig_partial_sign_clear(&sk, k);
    return 1;
}